

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_expression.hpp
# Opt level: O0

value_type
remora::
max<remora::vector_unary<remora::vector<double,remora::cpu_tag>,remora::device_traits<remora::cpu_tag>::abs<double>>,remora::cpu_tag>
          (vector_expression<remora::vector_unary<remora::vector<double,_remora::cpu_tag>,_remora::device_traits<remora::cpu_tag>::abs<double>_>,_remora::cpu_tag>
           *v)

{
  vector_expression<remora::vector_unary<remora::vector<double,_remora::cpu_tag>,_remora::device_traits<remora::cpu_tag>::abs<double>_>,_remora::cpu_tag>
  *v_00;
  result_type *value;
  value_type result;
  vector_unary<remora::vector<double,_remora::cpu_tag>,_remora::device_traits<remora::cpu_tag>::abs<double>_>
  *elem_result;
  
  v_00 = (vector_expression<remora::vector_unary<remora::vector<double,_remora::cpu_tag>,_remora::device_traits<remora::cpu_tag>::abs<double>_>,_remora::cpu_tag>
          *)eval_block<remora::vector_unary<remora::vector<double,remora::cpu_tag>,remora::device_traits<remora::cpu_tag>::abs<double>>,remora::cpu_tag>
                      ((vector_expression<remora::vector_unary<remora::vector<double,_remora::cpu_tag>,_remora::device_traits<remora::cpu_tag>::abs<double>_>,_remora::cpu_tag>
                        *)0x137613);
  value = (result_type *)std::numeric_limits<double>::lowest();
  kernels::
  vector_fold<remora::device_traits<remora::cpu_tag>::max<double>,remora::vector_unary<remora::vector<double,remora::cpu_tag>,remora::device_traits<remora::cpu_tag>::abs<double>>,remora::cpu_tag>
            (v_00,value);
  return (value_type)value;
}

Assistant:

typename VecV::value_type
max(vector_expression<VecV, Device> const& v) {
	typedef typename VecV::value_type value_type;
	typedef typename device_traits<Device>:: template max<value_type> functor_type;
	auto const& elem_result = eval_block(v);
	value_type result = std::numeric_limits<value_type>::lowest();
	kernels::vector_fold<functor_type>(elem_result,result);
	return result;
}